

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_unnest.cpp
# Opt level: O1

vector<duckdb::ColumnBinding,_true> * __thiscall
duckdb::LogicalUnnest::GetColumnBindings
          (vector<duckdb::ColumnBinding,_true> *__return_storage_ptr__,LogicalUnnest *this)

{
  reference this_00;
  pointer pLVar1;
  unsigned_long local_28;
  
  this_00 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
            ::operator[](&(this->super_LogicalOperator).children,0);
  pLVar1 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->(this_00);
  (*pLVar1->_vptr_LogicalOperator[2])(__return_storage_ptr__,pLVar1);
  local_28 = 0;
  if ((this->super_LogicalOperator).expressions.
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->super_LogicalOperator).expressions.
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    do {
      ::std::vector<duckdb::ColumnBinding,std::allocator<duckdb::ColumnBinding>>::
      emplace_back<unsigned_long&,unsigned_long&>
                ((vector<duckdb::ColumnBinding,std::allocator<duckdb::ColumnBinding>> *)
                 __return_storage_ptr__,&this->unnest_index,&local_28);
      local_28 = local_28 + 1;
    } while (local_28 <
             (ulong)((long)(this->super_LogicalOperator).expressions.
                           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                           .
                           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->super_LogicalOperator).expressions.
                           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                           .
                           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  return __return_storage_ptr__;
}

Assistant:

vector<ColumnBinding> LogicalUnnest::GetColumnBindings() {
	auto child_bindings = children[0]->GetColumnBindings();
	for (idx_t i = 0; i < expressions.size(); i++) {
		child_bindings.emplace_back(unnest_index, i);
	}
	return child_bindings;
}